

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.h
# Opt level: O3

string * google::protobuf::compiler::objectivec::
         GetOptionalDeprecatedAttribute<google::protobuf::FieldDescriptor>
                   (string *__return_storage_ptr__,FieldDescriptor *descriptor,FileDescriptor *file,
                   bool preSpace,bool postNewline)

{
  undefined8 *puVar1;
  long lVar2;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  string message;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70 [2];
  long local_60 [2];
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  if (file == (FileDescriptor *)0x0 || *(char *)(*(long *)(descriptor + 0x78) + 0x4e) != '\0') {
    if (*(char *)(*(long *)(descriptor + 0x78) + 0x4e) == '\0') {
LAB_002e88dc:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      return __return_storage_ptr__;
    }
    local_50 = local_40;
    local_48 = 0;
    local_40[0] = 0;
    puVar1 = *(undefined8 **)(descriptor + 0x28);
    local_70[0] = local_60;
    lVar2 = **(long **)(descriptor + 8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_70,lVar2,(*(long **)(descriptor + 8))[1] + lVar2);
    std::__cxx11::string::append((char *)local_70);
    plVar3 = (long *)std::__cxx11::string::_M_append((char *)local_70,*(ulong *)*puVar1);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_80 = *plVar4;
      lStack_78 = plVar3[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar4;
      local_90 = (long *)*plVar3;
    }
    local_88 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_90);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_a0 = *plVar4;
      lStack_98 = plVar3[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *plVar4;
      local_b0 = (long *)*plVar3;
    }
    local_a8 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_50,(string *)&local_b0);
    if (local_b0 != &local_a0) {
      operator_delete(local_b0);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    plVar3 = local_70[0];
    if (local_70[0] == local_60) goto LAB_002e8880;
  }
  else {
    if (*(char *)(*(long *)(file + 0x88) + 0x9f) == '\0') goto LAB_002e88dc;
    local_50 = local_40;
    local_48 = 0;
    local_40[0] = 0;
    lVar2 = *(long *)**(long **)(descriptor + 0x28);
    local_b0 = &local_a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,lVar2,((long *)**(long **)(descriptor + 0x28))[1] + lVar2);
    std::__cxx11::string::append((char *)&local_b0);
    std::__cxx11::string::operator=((string *)&local_50,(string *)&local_b0);
    plVar3 = local_b0;
    if (local_b0 == &local_a0) goto LAB_002e8880;
  }
  operator_delete(plVar3);
LAB_002e8880:
  local_90 = &local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"GPB_DEPRECATED_MSG(\"","");
  plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_50);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_a0 = *plVar4;
    lStack_98 = plVar3[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar4;
    local_b0 = (long *)*plVar3;
  }
  local_a8 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_b0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar5 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar5) {
    lVar2 = plVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (preSpace) {
    std::__cxx11::string::replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x3a90c4);
  }
  if (postNewline) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

string GetOptionalDeprecatedAttribute(
    const TDescriptor* descriptor,
    const FileDescriptor* file = NULL,
    bool preSpace = true, bool postNewline = false) {
  bool isDeprecated = descriptor->options().deprecated();
  // The file is only passed when checking Messages & Enums, so those types
  // get tagged. At the moment, it doesn't seem to make sense to tag every
  // field or enum value with when the file is deprecated.
  bool isFileLevelDeprecation = false;
  if (!isDeprecated && file) {
    isFileLevelDeprecation = file->options().deprecated();
    isDeprecated = isFileLevelDeprecation;
  }
  if (isDeprecated) {
    string message;
    const FileDescriptor* sourceFile = descriptor->file();
    if (isFileLevelDeprecation) {
      message = sourceFile->name() + " is deprecated.";
    } else {
      message = descriptor->full_name() + " is deprecated (see " +
                sourceFile->name() + ").";
    }

    string result = string("GPB_DEPRECATED_MSG(\"") + message + "\")";
    if (preSpace) {
      result.insert(0, " ");
    }
    if (postNewline) {
      result.append("\n");
    }
    return result;
  } else {
    return "";
  }
}